

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

bool __thiscall CChat::CompleteCommand(CChat *this)

{
  int iVar1;
  CCommand *pCVar2;
  char *pcVar3;
  CCommandManager *in_RDI;
  long in_FS_OFFSET;
  CCommand *pCommand;
  char aBuf [128];
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  bool local_89;
  char local_88 [128];
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = CCommandManager::CommandCount((CCommandManager *)0x14ee07);
  if (iVar1 == *(int *)&in_RDI[0x1215].m_aCommands.list) {
    local_89 = false;
  }
  else {
    pCVar2 = CCommandManager::GetCommand(in_RDI,in_stack_ffffffffffffff54);
    if (pCVar2 != (CCommand *)0x0) {
      pcVar3 = CLineInput::GetString((CLineInput *)(in_RDI + 0xb));
      pcVar3 = str_find(pcVar3," ");
      if (pcVar3 == (char *)0x0) {
        str_format(local_88,0x80,"/%s ",pCVar2);
        CLineInput::Set((CLineInput *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
        local_89 = true;
        goto LAB_0014eead;
      }
    }
    local_89 = false;
  }
LAB_0014eead:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool CChat::CompleteCommand()
{
	if(m_CommandManager.CommandCount() - m_FilteredCount == 0)
		return false;

	const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(m_SelectedCommand);
	if(!pCommand || str_find(m_Input.GetString(), " "))
		return false;

	// autocomplete command
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "/%s ", pCommand->m_aName);

	m_Input.Set(aBuf);
	return true;
}